

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

void __thiscall google::protobuf::json_internal::JsonWriter::Write(JsonWriter *this,uint32_t val)

{
  int iVar1;
  uint32_t val_local;
  FormatSpec<unsigned_int> local_38;
  char buf [22];
  
  local_38.super_type.spec_.data_ = "%d";
  local_38.super_type.spec_.size_ = 2;
  val_local = val;
  iVar1 = absl::lts_20240722::SNPrintF<unsigned_int>(buf,0x16,&local_38,&val_local);
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&this->sink_,buf,(long)iVar1);
  return;
}

Assistant:

void Write(uint32_t val) {
    char buf[22];
    int len = absl::SNPrintF(buf, sizeof(buf), "%d", val);
    absl::string_view view(buf, static_cast<size_t>(len));
    Write(view);
  }